

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O1

void __thiscall
btQuantizedBvh::deSerializeDouble
          (btQuantizedBvh *this,btQuantizedBvhDoubleData *quantizedBvhDoubleData)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  double *pdVar3;
  char *pcVar4;
  uint uVar5;
  int iVar6;
  btQuantizedBvhNode *ptr;
  btQuantizedBvhNodeData *pbVar7;
  btBvhSubtreeInfo *pbVar8;
  btBvhSubtreeInfoData *pbVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  long lVar17;
  btOptimizedBvhNode *pbVar18;
  btOptimizedBvhNodeDoubleData *pbVar19;
  btQuantizedBvhNode *pbVar20;
  btBvhSubtreeInfo *pbVar21;
  long lVar22;
  int *piVar23;
  int i;
  ulong uVar24;
  btOptimizedBvhNode *pbVar25;
  
  lVar17 = 0;
  do {
    pdVar3 = (quantizedBvhDoubleData->m_bvhAabbMax).m_floats + lVar17;
    *(ulong *)((this->m_bvhAabbMax).m_floats + lVar17) = CONCAT44((float)pdVar3[1],(float)*pdVar3);
    lVar17 = lVar17 + 2;
  } while (lVar17 != 4);
  lVar17 = 0;
  do {
    pdVar3 = (quantizedBvhDoubleData->m_bvhAabbMin).m_floats + lVar17;
    *(ulong *)((this->m_bvhAabbMin).m_floats + lVar17) = CONCAT44((float)pdVar3[1],(float)*pdVar3);
    lVar17 = lVar17 + 2;
  } while (lVar17 != 4);
  lVar17 = 0;
  do {
    pdVar3 = (quantizedBvhDoubleData->m_bvhQuantization).m_floats + lVar17;
    *(ulong *)((this->m_bvhQuantization).m_floats + lVar17) =
         CONCAT44((float)pdVar3[1],(float)*pdVar3);
    lVar17 = lVar17 + 2;
  } while (lVar17 != 4);
  this->m_curNodeIndex = quantizedBvhDoubleData->m_curNodeIndex;
  this->m_useQuantization = quantizedBvhDoubleData->m_useQuantization != 0;
  uVar5 = quantizedBvhDoubleData->m_numContiguousLeafNodes;
  iVar6 = (this->m_contiguousNodes).m_size;
  if ((iVar6 <= (int)uVar5) && (iVar6 < (int)uVar5)) {
    if ((this->m_contiguousNodes).m_capacity < (int)uVar5) {
      if (uVar5 == 0) {
        pbVar18 = (btOptimizedBvhNode *)0x0;
      }
      else {
        pbVar18 = (btOptimizedBvhNode *)btAlignedAllocInternal((long)(int)uVar5 << 6,0x10);
      }
      lVar17 = (long)(this->m_contiguousNodes).m_size;
      if (0 < lVar17) {
        lVar22 = 0;
        do {
          pbVar25 = (this->m_contiguousNodes).m_data;
          puVar1 = (undefined8 *)((long)(pbVar25->m_aabbMinOrg).m_floats + lVar22);
          uVar10 = *puVar1;
          uVar11 = puVar1[1];
          puVar1 = (undefined8 *)((long)(pbVar25->m_aabbMaxOrg).m_floats + lVar22);
          uVar12 = *puVar1;
          uVar13 = puVar1[1];
          uVar14 = *(undefined8 *)(pbVar25->m_padding + lVar22 + -0xc);
          uVar15 = *(undefined8 *)(pbVar25->m_padding + lVar22 + -0xc + 8);
          uVar16 = *(undefined8 *)(pbVar25->m_padding + lVar22 + 4 + 8);
          *(undefined8 *)(pbVar18->m_padding + lVar22 + 4) =
               *(undefined8 *)(pbVar25->m_padding + lVar22 + 4);
          *(undefined8 *)(pbVar18->m_padding + lVar22 + 4 + 8) = uVar16;
          *(undefined8 *)(pbVar18->m_padding + lVar22 + -0xc) = uVar14;
          *(undefined8 *)(pbVar18->m_padding + lVar22 + -0xc + 8) = uVar15;
          puVar1 = (undefined8 *)((long)(pbVar18->m_aabbMaxOrg).m_floats + lVar22);
          *puVar1 = uVar12;
          puVar1[1] = uVar13;
          puVar1 = (undefined8 *)((long)(pbVar18->m_aabbMinOrg).m_floats + lVar22);
          *puVar1 = uVar10;
          puVar1[1] = uVar11;
          lVar22 = lVar22 + 0x40;
        } while (lVar17 * 0x40 != lVar22);
      }
      pbVar25 = (this->m_contiguousNodes).m_data;
      if (pbVar25 != (btOptimizedBvhNode *)0x0) {
        if ((this->m_contiguousNodes).m_ownsMemory == true) {
          btAlignedFreeInternal(pbVar25);
        }
        (this->m_contiguousNodes).m_data = (btOptimizedBvhNode *)0x0;
      }
      (this->m_contiguousNodes).m_ownsMemory = true;
      (this->m_contiguousNodes).m_data = pbVar18;
      (this->m_contiguousNodes).m_capacity = uVar5;
    }
    if (iVar6 < (int)uVar5) {
      lVar17 = (long)(int)uVar5 - (long)iVar6;
      lVar22 = (long)iVar6 << 6;
      do {
        pbVar18 = (this->m_contiguousNodes).m_data;
        pcVar4 = pbVar18->m_padding + lVar22 + 4;
        pcVar4[0] = '\0';
        pcVar4[1] = '\0';
        pcVar4[2] = '\0';
        pcVar4[3] = '\0';
        pcVar4[4] = '\0';
        pcVar4[5] = '\0';
        pcVar4[6] = '\0';
        pcVar4[7] = '\0';
        pcVar4[8] = '\0';
        pcVar4[9] = '\0';
        pcVar4[10] = '\0';
        pcVar4[0xb] = '\0';
        pcVar4[0xc] = '\0';
        pcVar4[0xd] = '\0';
        pcVar4[0xe] = '\0';
        pcVar4[0xf] = '\0';
        pcVar4 = pbVar18->m_padding + lVar22 + -0xc;
        pcVar4[0] = '\0';
        pcVar4[1] = '\0';
        pcVar4[2] = '\0';
        pcVar4[3] = '\0';
        pcVar4[4] = '\0';
        pcVar4[5] = '\0';
        pcVar4[6] = '\0';
        pcVar4[7] = '\0';
        pcVar4[8] = '\0';
        pcVar4[9] = '\0';
        pcVar4[10] = '\0';
        pcVar4[0xb] = '\0';
        pcVar4[0xc] = '\0';
        pcVar4[0xd] = '\0';
        pcVar4[0xe] = '\0';
        pcVar4[0xf] = '\0';
        puVar1 = (undefined8 *)((long)(pbVar18->m_aabbMaxOrg).m_floats + lVar22);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)(pbVar18->m_aabbMinOrg).m_floats + lVar22);
        *puVar1 = 0;
        puVar1[1] = 0;
        lVar22 = lVar22 + 0x40;
        lVar17 = lVar17 + -1;
      } while (lVar17 != 0);
    }
  }
  (this->m_contiguousNodes).m_size = uVar5;
  if (0 < (int)uVar5) {
    pbVar19 = quantizedBvhDoubleData->m_contiguousNodesPtr;
    pbVar18 = (this->m_contiguousNodes).m_data;
    uVar24 = 0;
    pbVar25 = pbVar18;
    do {
      lVar17 = 4;
      do {
        pdVar3 = (pbVar19->m_aabbMinOrg).m_floats + lVar17;
        *(ulong *)((pbVar25->m_aabbMinOrg).m_floats + lVar17) =
             CONCAT44((float)pdVar3[1],(float)*pdVar3);
        lVar17 = lVar17 + 2;
      } while (lVar17 != 8);
      lVar17 = 0;
      do {
        pdVar3 = (pbVar19->m_aabbMinOrg).m_floats + lVar17;
        *(ulong *)((pbVar25->m_aabbMinOrg).m_floats + lVar17) =
             CONCAT44((float)pdVar3[1],(float)*pdVar3);
        lVar17 = lVar17 + 2;
      } while (lVar17 != 4);
      iVar6 = pbVar19->m_subPart;
      pbVar18[uVar24].m_escapeIndex = pbVar19->m_escapeIndex;
      pbVar18[uVar24].m_subPart = iVar6;
      pbVar18[uVar24].m_triangleIndex = pbVar19->m_triangleIndex;
      uVar24 = uVar24 + 1;
      pbVar19 = pbVar19 + 1;
      pbVar25 = pbVar25 + 1;
    } while (uVar24 != uVar5);
  }
  uVar5 = quantizedBvhDoubleData->m_numQuantizedContiguousNodes;
  iVar6 = (this->m_quantizedContiguousNodes).m_size;
  if ((iVar6 <= (int)uVar5) && (iVar6 < (int)uVar5)) {
    if ((this->m_quantizedContiguousNodes).m_capacity < (int)uVar5) {
      if (uVar5 == 0) {
        pbVar20 = (btQuantizedBvhNode *)0x0;
      }
      else {
        pbVar20 = (btQuantizedBvhNode *)btAlignedAllocInternal((long)(int)uVar5 << 4,0x10);
      }
      lVar17 = (long)(this->m_quantizedContiguousNodes).m_size;
      if (0 < lVar17) {
        lVar22 = 0;
        do {
          puVar1 = (undefined8 *)
                   ((long)((this->m_quantizedContiguousNodes).m_data)->m_quantizedAabbMin + lVar22);
          uVar10 = puVar1[1];
          puVar2 = (undefined8 *)((long)pbVar20->m_quantizedAabbMin + lVar22);
          *puVar2 = *puVar1;
          puVar2[1] = uVar10;
          lVar22 = lVar22 + 0x10;
        } while (lVar17 * 0x10 != lVar22);
      }
      ptr = (this->m_quantizedContiguousNodes).m_data;
      if (ptr != (btQuantizedBvhNode *)0x0) {
        if ((this->m_quantizedContiguousNodes).m_ownsMemory == true) {
          btAlignedFreeInternal(ptr);
        }
        (this->m_quantizedContiguousNodes).m_data = (btQuantizedBvhNode *)0x0;
      }
      (this->m_quantizedContiguousNodes).m_ownsMemory = true;
      (this->m_quantizedContiguousNodes).m_data = pbVar20;
      (this->m_quantizedContiguousNodes).m_capacity = uVar5;
    }
    if (iVar6 < (int)uVar5) {
      lVar17 = (long)(int)uVar5 - (long)iVar6;
      lVar22 = (long)iVar6 << 4;
      do {
        puVar1 = (undefined8 *)
                 ((long)((this->m_quantizedContiguousNodes).m_data)->m_quantizedAabbMin + lVar22);
        *puVar1 = 0;
        puVar1[1] = 0;
        lVar22 = lVar22 + 0x10;
        lVar17 = lVar17 + -1;
      } while (lVar17 != 0);
    }
  }
  (this->m_quantizedContiguousNodes).m_size = uVar5;
  if (0 < (int)uVar5) {
    pbVar7 = quantizedBvhDoubleData->m_quantizedContiguousNodesPtr;
    pbVar20 = (this->m_quantizedContiguousNodes).m_data;
    lVar17 = 0;
    do {
      *(undefined4 *)((long)pbVar20->m_quantizedAabbMax + lVar17 + 6) =
           *(undefined4 *)((long)pbVar7->m_quantizedAabbMax + lVar17 + 6);
      *(undefined2 *)((long)pbVar20->m_quantizedAabbMax + lVar17) =
           *(undefined2 *)((long)pbVar7->m_quantizedAabbMax + lVar17);
      *(undefined2 *)((long)pbVar20->m_quantizedAabbMax + lVar17 + 2) =
           *(undefined2 *)((long)pbVar7->m_quantizedAabbMax + lVar17 + 2);
      *(undefined2 *)((long)pbVar20->m_quantizedAabbMax + lVar17 + 4) =
           *(undefined2 *)((long)pbVar7->m_quantizedAabbMax + lVar17 + 4);
      *(undefined2 *)((long)pbVar20->m_quantizedAabbMin + lVar17) =
           *(undefined2 *)((long)pbVar7->m_quantizedAabbMin + lVar17);
      *(undefined2 *)((long)pbVar20->m_quantizedAabbMin + lVar17 + 2) =
           *(undefined2 *)((long)pbVar7->m_quantizedAabbMin + lVar17 + 2);
      *(undefined2 *)((long)pbVar20->m_quantizedAabbMin + lVar17 + 4) =
           *(undefined2 *)((long)pbVar7->m_quantizedAabbMin + lVar17 + 4);
      lVar17 = lVar17 + 0x10;
    } while ((ulong)uVar5 << 4 != lVar17);
  }
  this->m_traversalMode = quantizedBvhDoubleData->m_traversalMode;
  uVar5 = quantizedBvhDoubleData->m_numSubtreeHeaders;
  if (((this->m_SubtreeHeaders).m_size < (int)uVar5) &&
     ((this->m_SubtreeHeaders).m_capacity < (int)uVar5)) {
    if (uVar5 == 0) {
      pbVar21 = (btBvhSubtreeInfo *)0x0;
    }
    else {
      pbVar21 = (btBvhSubtreeInfo *)btAlignedAllocInternal((long)(int)uVar5 << 5,0x10);
    }
    lVar17 = (long)(this->m_SubtreeHeaders).m_size;
    if (0 < lVar17) {
      lVar22 = 0;
      do {
        pbVar8 = (this->m_SubtreeHeaders).m_data;
        puVar1 = (undefined8 *)((long)pbVar8->m_quantizedAabbMin + lVar22);
        uVar10 = *puVar1;
        uVar11 = puVar1[1];
        puVar1 = (undefined8 *)((long)pbVar8->m_padding + lVar22 + -4);
        uVar12 = puVar1[1];
        puVar2 = (undefined8 *)((long)pbVar21->m_padding + lVar22 + -4);
        *puVar2 = *puVar1;
        puVar2[1] = uVar12;
        puVar1 = (undefined8 *)((long)pbVar21->m_quantizedAabbMin + lVar22);
        *puVar1 = uVar10;
        puVar1[1] = uVar11;
        lVar22 = lVar22 + 0x20;
      } while (lVar17 * 0x20 != lVar22);
    }
    pbVar8 = (this->m_SubtreeHeaders).m_data;
    if (pbVar8 != (btBvhSubtreeInfo *)0x0) {
      if ((this->m_SubtreeHeaders).m_ownsMemory == true) {
        btAlignedFreeInternal(pbVar8);
      }
      (this->m_SubtreeHeaders).m_data = (btBvhSubtreeInfo *)0x0;
    }
    (this->m_SubtreeHeaders).m_ownsMemory = true;
    (this->m_SubtreeHeaders).m_data = pbVar21;
    (this->m_SubtreeHeaders).m_capacity = uVar5;
  }
  (this->m_SubtreeHeaders).m_size = uVar5;
  if (0 < (int)uVar5) {
    pbVar9 = quantizedBvhDoubleData->m_subTreeInfoPtr;
    piVar23 = &((this->m_SubtreeHeaders).m_data)->m_rootNodeIndex;
    lVar17 = 0;
    do {
      *(unsigned_short *)((long)piVar23 + -6) =
           *(unsigned_short *)((long)pbVar9->m_quantizedAabbMax + lVar17);
      *(unsigned_short *)(piVar23 + -1) =
           *(unsigned_short *)((long)pbVar9->m_quantizedAabbMax + lVar17 + 2);
      *(unsigned_short *)((long)piVar23 + -2) =
           *(unsigned_short *)((long)pbVar9->m_quantizedAabbMax + lVar17 + 4);
      ((btBvhSubtreeInfo *)(piVar23 + -3))->m_quantizedAabbMin[0] =
           *(unsigned_short *)((long)pbVar9->m_quantizedAabbMin + lVar17);
      *(unsigned_short *)((long)piVar23 + -10) =
           *(unsigned_short *)((long)pbVar9->m_quantizedAabbMin + lVar17 + 2);
      *(unsigned_short *)(piVar23 + -2) =
           *(unsigned_short *)((long)pbVar9->m_quantizedAabbMin + lVar17 + 4);
      *(undefined8 *)piVar23 = *(undefined8 *)((long)pbVar9->m_quantizedAabbMin + lVar17 + -8);
      piVar23 = piVar23 + 8;
      lVar17 = lVar17 + 0x14;
    } while ((ulong)uVar5 * 0x14 != lVar17);
  }
  return;
}

Assistant:

void btQuantizedBvh::deSerializeDouble(struct btQuantizedBvhDoubleData& quantizedBvhDoubleData)
{
	m_bvhAabbMax.deSerializeDouble(quantizedBvhDoubleData.m_bvhAabbMax);
	m_bvhAabbMin.deSerializeDouble(quantizedBvhDoubleData.m_bvhAabbMin);
	m_bvhQuantization.deSerializeDouble(quantizedBvhDoubleData.m_bvhQuantization);

	m_curNodeIndex = quantizedBvhDoubleData.m_curNodeIndex;
	m_useQuantization = quantizedBvhDoubleData.m_useQuantization!=0;
	
	{
		int numElem = quantizedBvhDoubleData.m_numContiguousLeafNodes;
		m_contiguousNodes.resize(numElem);

		if (numElem)
		{
			btOptimizedBvhNodeDoubleData* memPtr = quantizedBvhDoubleData.m_contiguousNodesPtr;

			for (int i=0;i<numElem;i++,memPtr++)
			{
				m_contiguousNodes[i].m_aabbMaxOrg.deSerializeDouble(memPtr->m_aabbMaxOrg);
				m_contiguousNodes[i].m_aabbMinOrg.deSerializeDouble(memPtr->m_aabbMinOrg);
				m_contiguousNodes[i].m_escapeIndex = memPtr->m_escapeIndex;
				m_contiguousNodes[i].m_subPart = memPtr->m_subPart;
				m_contiguousNodes[i].m_triangleIndex = memPtr->m_triangleIndex;
			}
		}
	}

	{
		int numElem = quantizedBvhDoubleData.m_numQuantizedContiguousNodes;
		m_quantizedContiguousNodes.resize(numElem);
		
		if (numElem)
		{
			btQuantizedBvhNodeData* memPtr = quantizedBvhDoubleData.m_quantizedContiguousNodesPtr;
			for (int i=0;i<numElem;i++,memPtr++)
			{
				m_quantizedContiguousNodes[i].m_escapeIndexOrTriangleIndex = memPtr->m_escapeIndexOrTriangleIndex;
				m_quantizedContiguousNodes[i].m_quantizedAabbMax[0] = memPtr->m_quantizedAabbMax[0];
				m_quantizedContiguousNodes[i].m_quantizedAabbMax[1] = memPtr->m_quantizedAabbMax[1];
				m_quantizedContiguousNodes[i].m_quantizedAabbMax[2] = memPtr->m_quantizedAabbMax[2];
				m_quantizedContiguousNodes[i].m_quantizedAabbMin[0] = memPtr->m_quantizedAabbMin[0];
				m_quantizedContiguousNodes[i].m_quantizedAabbMin[1] = memPtr->m_quantizedAabbMin[1];
				m_quantizedContiguousNodes[i].m_quantizedAabbMin[2] = memPtr->m_quantizedAabbMin[2];
			}
		}
	}

	m_traversalMode = btTraversalMode(quantizedBvhDoubleData.m_traversalMode);
	
	{
		int numElem = quantizedBvhDoubleData.m_numSubtreeHeaders;
		m_SubtreeHeaders.resize(numElem);
		if (numElem)
		{
			btBvhSubtreeInfoData* memPtr = quantizedBvhDoubleData.m_subTreeInfoPtr;
			for (int i=0;i<numElem;i++,memPtr++)
			{
				m_SubtreeHeaders[i].m_quantizedAabbMax[0] = memPtr->m_quantizedAabbMax[0] ;
				m_SubtreeHeaders[i].m_quantizedAabbMax[1] = memPtr->m_quantizedAabbMax[1];
				m_SubtreeHeaders[i].m_quantizedAabbMax[2] = memPtr->m_quantizedAabbMax[2];
				m_SubtreeHeaders[i].m_quantizedAabbMin[0] = memPtr->m_quantizedAabbMin[0];
				m_SubtreeHeaders[i].m_quantizedAabbMin[1] = memPtr->m_quantizedAabbMin[1];
				m_SubtreeHeaders[i].m_quantizedAabbMin[2] = memPtr->m_quantizedAabbMin[2];
				m_SubtreeHeaders[i].m_rootNodeIndex = memPtr->m_rootNodeIndex;
				m_SubtreeHeaders[i].m_subtreeSize = memPtr->m_subtreeSize;
			}
		}
	}

}